

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O0

uint auth_method_from_name(char *name)

{
  int iVar1;
  char *name_local;
  
  iVar1 = strcmp(name,"none");
  if (iVar1 == 0) {
    name_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp(name,"tis");
    if (iVar1 == 0) {
      name_local._4_4_ = 0x10;
    }
    else {
      iVar1 = strcmp(name,"cryptocard");
      if ((iVar1 != 0) && (iVar1 = strcmp(name,"ccard"), iVar1 != 0)) {
        iVar1 = strcmp(name,"keyboard-interactive");
        if ((iVar1 == 0) ||
           (((iVar1 = strcmp(name,"k-i"), iVar1 == 0 || (iVar1 = strcmp(name,"kbdint"), iVar1 == 0))
            || (iVar1 = strcmp(name,"ki"), iVar1 == 0)))) {
          return 8;
        }
        iVar1 = strcmp(name,"publickey");
        if (((iVar1 != 0) && (iVar1 = strcmp(name,"pubkey"), iVar1 != 0)) &&
           (iVar1 = strcmp(name,"pk"), iVar1 != 0)) {
          iVar1 = strcmp(name,"password");
          if ((iVar1 != 0) && (iVar1 = strcmp(name,"pw"), iVar1 != 0)) {
            return 0;
          }
          return 2;
        }
        return 4;
      }
      name_local._4_4_ = 0x20;
    }
  }
  return name_local._4_4_;
}

Assistant:

static unsigned auth_method_from_name(const char *name)
{
    if (!strcmp(name, "none"))
        return AUTHMETHOD_NONE;
    if (!strcmp(name, "tis"))
        return AUTHMETHOD_TIS;
    if (!strcmp(name, "cryptocard") || !strcmp(name, "ccard"))
        return AUTHMETHOD_CRYPTOCARD;
    if (!strcmp(name, "keyboard-interactive") || !strcmp(name, "k-i") ||
        !strcmp(name, "kbdint")  || !strcmp(name, "ki"))
        return AUTHMETHOD_KBDINT;
    if (!strcmp(name, "publickey") || !strcmp(name, "pubkey") ||
        !strcmp(name, "pk"))
        return AUTHMETHOD_PUBLICKEY;
    if (!strcmp(name, "password") || !strcmp(name, "pw"))
        return AUTHMETHOD_PASSWORD;
    return 0;
}